

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

ch_table_entry * find_entry(ch_table_entry *entries,uint32_t capacity,ch_string *key)

{
  ch_table_entry *pcVar1;
  uint uVar2;
  ch_table_entry *pcVar3;
  
  uVar2 = key->hash;
  pcVar3 = (ch_table_entry *)0x0;
  do {
    uVar2 = uVar2 & capacity - 1;
    pcVar1 = entries + uVar2;
    if (entries[uVar2].key == (ch_string *)0x0) {
      if (pcVar3 == (ch_table_entry *)0x0) {
        pcVar3 = pcVar1;
      }
      if ((pcVar1->value).type == PRIMITIVE_NULL) {
        return pcVar3;
      }
    }
    else if (entries[uVar2].key == key) {
      return pcVar1;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static ch_table_entry *find_entry(ch_table_entry *entries, uint32_t capacity,
                                  ch_string *key) {
  uint32_t index = key->hash & (capacity - 1);
  ch_table_entry *tombstone = NULL;
  for (;;) {
    ch_table_entry *entry = &entries[index];
    if (entry->key == NULL) {
      if (IS_NULL(entry->value)) {
        return tombstone != NULL ? tombstone : entry;
      } else {
        if (tombstone == NULL)
          tombstone = entry;
      }
    } else if (entry->key == key) {
      return entry;
    }

    index = (index + 1) & (capacity - 1);
  }
}